

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O3

void pelelm_dcma(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,Geometry *param_6,
                Real param_7,int *param_8,int param_9)

{
  Box *pBVar1;
  Box *pBVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  double *pdVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  Real RVar18;
  int iVar19;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  double *pdVar28;
  Array<Real,_9> *pAVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  double *pdVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int n;
  long lVar38;
  long lVar39;
  double *pdVar40;
  long lVar41;
  bool bVar42;
  byte bVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  long local_370;
  double *local_368;
  double *local_360;
  double local_298 [9];
  double local_250 [15];
  int local_1d8;
  int iStack_1d4;
  int local_158;
  int iStack_154;
  double local_78 [8];
  undefined1 *local_38;
  long lVar20;
  
  bVar43 = 0;
  pBVar1 = &(datfab->super_BaseFab<double>).domain;
  lVar36 = ((long)(datfab->super_BaseFab<double>).domain.bigend.vect[0] -
           (long)(pBVar1->smallend).vect[0]) + 1;
  pdVar11 = (derfab->super_BaseFab<double>).dptr;
  pBVar2 = &(derfab->super_BaseFab<double>).domain;
  iVar4 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar31 = ((long)(derfab->super_BaseFab<double>).domain.bigend.vect[0] -
           (long)(pBVar2->smallend).vect[0]) + 1;
  uVar17 = *(undefined8 *)(pBVar2->smallend).vect;
  lVar38 = (((long)(derfab->super_BaseFab<double>).domain.bigend.vect[1] + 1) -
           (long)(derfab->super_BaseFab<double>).domain.smallend.vect[1]) * lVar31;
  lVar41 = (((long)(derfab->super_BaseFab<double>).domain.bigend.vect[2] - (long)iVar4) + 1) *
           lVar38;
  lVar27 = lVar41 * dcomp;
  lVar23 = (dcomp + 1) * lVar41;
  pdVar12 = (datfab->super_BaseFab<double>).dptr;
  iVar5 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  uVar16 = *(undefined8 *)(pBVar1->smallend).vect;
  lVar35 = (((long)(datfab->super_BaseFab<double>).domain.bigend.vect[1] + 1) -
           (long)(datfab->super_BaseFab<double>).domain.smallend.vect[1]) * lVar36;
  lVar39 = (((long)(datfab->super_BaseFab<double>).domain.bigend.vect[2] - (long)iVar5) + 1) *
           lVar35;
  amrex::Abort_host("C12H25O2 is not present in your chemistry: do not use dcma.");
  RVar18 = PeleLM::Zox;
  pAVar29 = &PeleLM::spec_Bilger_fact;
  pdVar28 = local_250 + 2;
  for (lVar24 = 9; lVar24 != 0; lVar24 = lVar24 + -1) {
    *pdVar28 = pAVar29->_M_elems[0];
    pAVar29 = (Array<Real,_9> *)((long)pAVar29 + ((ulong)bVar43 * -2 + 1) * 8);
    pdVar28 = pdVar28 + (ulong)bVar43 * -2 + 1;
  }
  dVar44 = PeleLM::Zfu - PeleLM::Zox;
  iVar19 = (bx->smallend).vect[2];
  iVar6 = (bx->bigend).vect[2];
  if (iVar19 <= iVar6) {
    iVar7 = (bx->bigend).vect[0];
    iVar8 = (bx->bigend).vect[1];
    iVar9 = (bx->smallend).vect[1];
    lVar30 = (long)iVar9;
    iVar10 = (bx->smallend).vect[0];
    lVar24 = (long)iVar10 * 8;
    do {
      lVar20 = (long)iVar19;
      if (iVar9 <= iVar8) {
        local_1d8 = (int)uVar16;
        iStack_1d4 = (int)((ulong)uVar16 >> 0x20);
        lVar25 = (lVar20 - iVar4) * lVar38;
        local_158 = (int)uVar17;
        iStack_154 = (int)((ulong)uVar17 >> 0x20);
        lVar32 = (lVar20 - iVar4) * lVar38;
        local_360 = (double *)
                    ((long)pdVar12 +
                    (lVar30 - iStack_1d4) * lVar36 * 8 + (lVar20 - iVar5) * lVar35 * 8 +
                    (long)local_1d8 * -8 + lVar24 + lVar39 * 8);
        local_368 = (double *)
                    ((long)pdVar11 +
                    (lVar30 - iStack_154) * lVar31 * 8 + (lVar20 - iVar4) * lVar38 * 8 +
                    (long)local_158 * -8 + lVar24 + lVar41 * 0x58);
        local_370 = lVar30;
        do {
          if (iVar10 <= iVar7) {
            lVar21 = (local_370 - iStack_154) * lVar31;
            lVar22 = (local_370 - iStack_154) * lVar31;
            lVar26 = (long)iVar10;
            pdVar28 = local_368;
            pdVar40 = local_360;
            do {
              dVar3 = pdVar12[(lVar20 - iVar5) * lVar35 +
                              (local_370 - iStack_1d4) * lVar36 + (lVar26 - local_1d8)];
              lVar37 = lVar26 - local_158;
              pdVar11[lVar27 + lVar25 + lVar21 + lVar37] = 0.0;
              dVar15 = 0.0;
              lVar33 = 2;
              pdVar34 = pdVar40;
              do {
                dVar15 = dVar15 + *pdVar34 * local_250[lVar33] * (1.0 / dVar3);
                pdVar11[lVar27 + lVar25 + lVar21 + lVar37] = dVar15;
                lVar33 = lVar33 + 1;
                pdVar34 = pdVar34 + lVar39;
              } while (lVar33 != 0xb);
              pdVar11[lVar27 + lVar25 + lVar21 + lVar37] = (dVar15 - RVar18) * (1.0 / dVar44);
              dVar3 = pdVar11[lVar41 * 10 +
                              (lVar20 - iVar4) * lVar38 +
                              (local_370 - iStack_154) * lVar31 + (lVar26 - local_158)];
              dVar45 = dVar3 * dVar3;
              dVar46 = dVar3 * dVar45;
              dVar47 = dVar3 * dVar46;
              local_78[0] = 0.49603174603174605;
              local_78[1] = 0.03125195324707794;
              local_78[2] = 0.055509297807382736;
              local_78[3] = 0.9920634920634921;
              local_78[4] = 0.06250390649415588;
              local_78[5] = 0.05879931792791203;
              local_78[6] = 0.030297521662727988;
              local_78[7] = 0.029399658963956014;
              local_38 = &DAT_3fa246cdaf410bdd;
              dVar15 = 1.0 / dVar3;
              if (1000.0 <= dVar3) {
                local_298[0] = dVar15 * -835.033997 +
                               dVar47 * 3.16550358e-16 +
                               dVar46 * -2.30789455e-12 +
                               dVar45 * -1.8779429e-08 + dVar3 * 0.000350032206 + 2.99142337;
                local_298[1] = dVar15 * -1233.93018 +
                               dVar47 * -2.27287062e-16 +
                               dVar46 * 4.4382037e-12 +
                               dVar45 * -4.19613997e-08 + dVar3 * 0.000306759845 + 3.69757819;
                local_298[4] = dVar15 * 29230.8027 +
                               dVar47 * -8.736103e-17 +
                               dVar46 * 1.13776685e-12 +
                               dVar45 * -1.03426778e-09 + dVar3 * -1.37753096e-05 + 2.54205966;
                local_298[5] = dVar15 * 3683.62875 +
                               dVar47 * -2.66391752e-16 +
                               dVar46 * 7.63046685e-12 +
                               dVar45 * -8.63609193e-08 + dVar3 * 0.00052825224 + 2.86472886;
                local_298[6] = dVar15 * 111.856713 +
                               dVar47 * -2.1581707e-15 +
                               dVar46 * 2.85615925e-11 +
                               dVar45 * -2.11219383e-07 + dVar3 * 0.00111991006 + 4.0172109;
                local_298[7] = dVar15 * -18006.9609 +
                               dVar47 * -2.86330712e-15 +
                               dVar46 * 5.87225893e-11 +
                               dVar45 * -4.9156294e-07 + dVar3 * 0.0021680682 + 4.57316685;
                dVar48 = dVar47 * -1.27832357e-15 +
                         dVar46 * 3.00249098e-11 +
                         dVar45 * -2.9100867e-07 + dVar3 * 0.00152814644 + 2.67214561;
                dVar49 = dVar47 * -1.3506702e-15 +
                         dVar46 * 2.52426e-11 +
                         dVar45 * -1.89492033e-07 + dVar3 * 0.0007439885 + 2.92664;
                dVar13 = -29899.209;
                dVar14 = -922.7977;
              }
              else {
                local_298[0] = dVar15 * -1012.52087 +
                               dVar47 * 8.26974448e-14 +
                               dVar46 * -2.36885858e-11 +
                               dVar45 * -2.71433843e-07 + dVar3 * 0.000412472087 + 3.29812431;
                local_298[1] = dVar15 * -1005.24902 +
                               dVar47 * -1.75371078e-13 +
                               dVar46 * 3.28469308e-10 +
                               dVar45 * -1.91871682e-07 + dVar3 * 0.000563743175 + 3.2129364;
                local_298[4] = dVar15 * 29147.6445 +
                               dVar47 * 7.78139272e-14 +
                               dVar46 * -4.00710797e-10 +
                               dVar45 * 8.07010567e-07 + dVar3 * -0.000819083245 + 2.94642878;
                local_298[5] = dVar15 * 3346.30913 +
                               dVar47 * 4.12474758e-13 +
                               dVar46 * -1.44963411e-09 +
                               dVar45 * 2.1758823e-06 + dVar3 * -0.0016127247 + 4.12530561;
                local_298[6] = dVar15 * 294.80804 +
                               dVar47 * 1.85845025e-12 +
                               dVar46 * -6.06909735e-09 +
                               dVar45 * 7.05276303e-06 + dVar3 * -0.00237456025 + 4.30179801;
                local_298[7] = dVar15 * -17663.1465 +
                               dVar47 * 4.9430295e-13 +
                               dVar46 * -1.15645138e-09 +
                               dVar45 * -4.95004193e-08 + dVar3 * 0.0032846129 + 3.38875365;
                dVar48 = dVar47 * -5.01317694e-13 +
                         dVar46 * 1.74214532e-09 +
                         dVar45 * -2.11823211e-06 + dVar3 * 0.00173749123 + 3.38684249;
                dVar49 = dVar47 * -4.88971e-13 +
                         dVar46 * 1.41037875e-09 +
                         dVar45 * -1.321074e-06 + dVar3 * 0.00070412 + 3.298677;
                dVar13 = -30208.1133;
                dVar14 = -1020.9;
              }
              local_298[2] = dVar15 * dVar13 + dVar48;
              local_298[3] = dVar15 * 25471.627 +
                             dVar47 * 0.0 + dVar46 * 0.0 + dVar45 * 0.0 + dVar3 * 0.0 + 2.5;
              local_298[8] = dVar15 * dVar14 + dVar49;
              lVar33 = 0;
              do {
                local_298[lVar33] = local_78[lVar33] * dVar3 * 83144626.1815324 * local_298[lVar33];
                lVar33 = lVar33 + 1;
              } while (lVar33 != 9);
              pdVar11[lVar23 + lVar32 + lVar22 + (lVar26 - local_158)] = 0.0;
              dVar3 = 0.0;
              lVar33 = 0;
              pdVar34 = pdVar28;
              do {
                dVar15 = local_298[lVar33];
                local_298[lVar33] = dVar15 * 0.0001;
                dVar3 = dVar3 - dVar15 * 0.0001 * *pdVar34;
                pdVar11[lVar23 + lVar32 + lVar22 + (lVar26 - local_158)] = dVar3;
                lVar33 = lVar33 + 1;
                pdVar34 = pdVar34 + lVar41;
              } while (lVar33 != 9);
              lVar26 = lVar26 + 1;
              pdVar40 = pdVar40 + 1;
              pdVar28 = pdVar28 + 1;
            } while (iVar7 + 1 != (int)lVar26);
          }
          local_370 = local_370 + 1;
          local_360 = local_360 + lVar36;
          local_368 = local_368 + lVar31;
        } while (iVar8 + 1 != (int)local_370);
      }
      bVar42 = iVar19 != iVar6;
      iVar19 = iVar19 + 1;
    } while (bVar42);
  }
  return;
}

Assistant:

void pelelm_dcma (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                              const FArrayBox& datfab, const Geometry& /*geomdata*/,
                              Real /*time*/, const int* /*bcrec*/, int /*level*/)

{   
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(Box(datfab.box()).enclosedCells().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= 2*NUM_SPECIES+2);
    AMREX_ASSERT(ncomp == 4);
    auto const density   = datfab.array(0);
    auto const rhoY      = datfab.array(1);
    auto const Temp      = derfab.array(NUM_SPECIES+1);
    auto const rhoY_dot  = derfab.array(NUM_SPECIES+2);
    auto       mixt_frac = derfab.array(dcomp);
    auto       hr        = derfab.array(dcomp+1);

#ifdef C12H25O2_ID
    auto       Y1        = derfab.array(dcomp+2);
    auto       Y2        = derfab.array(dcomp+3);
    int        OH        = OH_ID;
    int        RO2       = C12H25O2_ID;
#else
    amrex::Abort("C12H25O2 is not present in your chemistry: do not use dcma.");
#endif

    // TODO probably better way to do this ?
    amrex::Real Zox_lcl   = PeleLM::Zox;
    amrex::Real Zfu_lcl   = PeleLM::Zfu;
    amrex::Real denom_inv = 1.0 / (Zfu_lcl - Zox_lcl);
    amrex::GpuArray<amrex::Real,NUM_SPECIES> fact_lcl;
    for (int n=0; n<NUM_SPECIES; ++n) {
        fact_lcl[n] = PeleLM::spec_Bilger_fact[n];
    }

    amrex::ParallelFor(bx, 
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {   
        // Z
        calcMixtFrac(i,j,k,
                     Zox_lcl, denom_inv, fact_lcl.data(),
                     density, rhoY, mixt_frac);
        auto eos = pele::physics::PhysicsType::eos();
        // HR
        amrex::Real hi_spec[NUM_SPECIES] = {0.0};
        eos.T2Hi(Temp(i,j,k),hi_spec);
        hr(i,j,k) = 0.0;
        for (int n = 0; n < NUM_SPECIES; n++) {
            hi_spec[n] *= 0.0001;   // erg/g -> J/kg
            hr(i,j,k) -= rhoY_dot(i,j,k,n)*hi_spec[n];
        }

        // Y
#ifdef C12H25O2_ID
        amrex::Real rho_inv = 1.0 / density(i,j,k);
        Y1(i,j,k) = rhoY(i,j,k,OH)  * rho_inv; 
        Y2(i,j,k) = rhoY(i,j,k,RO2) * rho_inv; 
#endif
    });
}